

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O3

void Diligent::GetAllowedStagesAndAccessMask
               (BIND_FLAGS Flags,VkPipelineStageFlags *StageMask,VkAccessFlags *AccessMask)

{
  BIND_FLAGS BVar1;
  bool bVar2;
  string msg;
  string local_50;
  
  *StageMask = 0x1000;
  *AccessMask = 0x1800;
  if (Flags != BIND_NONE) {
    do {
      BVar1 = -Flags & Flags;
      if ((int)BVar1 < 0x80) {
        switch(BVar1) {
        case BIND_VERTEX_BUFFER:
          *(byte *)StageMask = (byte)*StageMask | 4;
          *(byte *)AccessMask = (byte)*AccessMask | 4;
          break;
        case BIND_INDEX_BUFFER:
          *(byte *)StageMask = (byte)*StageMask | 4;
          *(byte *)AccessMask = (byte)*AccessMask | 2;
          break;
        case BIND_INDEX_BUFFER|BIND_VERTEX_BUFFER:
        case BIND_UNIFORM_BUFFER|BIND_VERTEX_BUFFER:
        case BIND_UNIFORM_BUFFER|BIND_INDEX_BUFFER:
        case BIND_UNIFORM_BUFFER|BIND_INDEX_BUFFER|BIND_VERTEX_BUFFER:
switchD_00278308_caseD_3:
          FormatString<char[21]>(&local_50,(char (*) [21])"Unexpected bind flag");
          DebugAssertionFailed
                    (local_50._M_dataplus._M_p,"GetAllowedStagesAndAccessMask",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
                     ,0x8a1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          break;
        case BIND_UNIFORM_BUFFER:
          *StageMask = *StageMask | 0x3808f8;
          *(byte *)AccessMask = (byte)*AccessMask | 8;
          break;
        case BIND_SHADER_RESOURCE:
          *StageMask = *StageMask | 0x3808f8;
          *(byte *)AccessMask = (byte)*AccessMask | 0x20;
          break;
        default:
          if (BVar1 == BIND_RENDER_TARGET) {
            *(byte *)((long)StageMask + 1) = *(byte *)((long)StageMask + 1) | 4;
            *AccessMask = *AccessMask | 0x180;
          }
          else {
            if (BVar1 != BIND_DEPTH_STENCIL) goto switchD_00278308_caseD_3;
            *(byte *)((long)StageMask + 1) = *(byte *)((long)StageMask + 1) | 3;
            *(byte *)((long)AccessMask + 1) = *(byte *)((long)AccessMask + 1) | 6;
          }
        }
      }
      else if ((int)BVar1 < 0x200) {
        if (BVar1 == BIND_UNORDERED_ACCESS) {
          *StageMask = *StageMask | 0x3808f8;
          *(byte *)AccessMask = (byte)*AccessMask | 0x60;
        }
        else {
          if (BVar1 != BIND_INDIRECT_DRAW_ARGS) goto switchD_00278308_caseD_3;
          *(byte *)StageMask = (byte)*StageMask | 2;
          *(byte *)AccessMask = (byte)*AccessMask | 1;
        }
      }
      else if (BVar1 == BIND_INPUT_ATTACHMENT) {
        *(byte *)StageMask = (byte)*StageMask | 0x80;
        *(byte *)AccessMask = (byte)*AccessMask | 0x10;
      }
      else if (BVar1 == BIND_RAY_TRACING) {
        *StageMask = *StageMask | 0x2200000;
        *(byte *)((long)AccessMask + 2) = *(byte *)((long)AccessMask + 2) | 0x60;
      }
      else {
        if (BVar1 != BIND_FLAG_LAST) goto switchD_00278308_caseD_3;
        *(byte *)((long)StageMask + 2) = *(byte *)((long)StageMask + 2) | 0xc0;
        *AccessMask = *AccessMask | 0x1800000;
      }
      bVar2 = BVar1 != Flags;
      Flags = BVar1 ^ Flags;
    } while (bVar2);
  }
  return;
}

Assistant:

void GetAllowedStagesAndAccessMask(BIND_FLAGS Flags, VkPipelineStageFlags& StageMask, VkAccessFlags& AccessMask)
{
    StageMask  = VK_PIPELINE_STAGE_TRANSFER_BIT;
    AccessMask = VK_ACCESS_TRANSFER_READ_BIT | VK_ACCESS_TRANSFER_WRITE_BIT;
    while (Flags != BIND_NONE)
    {
        BIND_FLAGS FlagBit = ExtractLSB(Flags);
        static_assert(BIND_FLAG_LAST == (1u << 11), "This function must be updated to handle new bind flag");
        switch (FlagBit)
        {
            case BIND_VERTEX_BUFFER:
                StageMask |= VK_PIPELINE_STAGE_VERTEX_INPUT_BIT;
                AccessMask |= VK_ACCESS_VERTEX_ATTRIBUTE_READ_BIT;
                break;
            case BIND_INDEX_BUFFER:
                StageMask |= VK_PIPELINE_STAGE_VERTEX_INPUT_BIT;
                AccessMask |= VK_ACCESS_INDEX_READ_BIT;
                break;
            case BIND_UNIFORM_BUFFER:
                StageMask |= VulkanUtilities::VK_PIPELINE_STAGE_ALL_SHADERS;
                AccessMask |= VK_ACCESS_UNIFORM_READ_BIT;
                break;
            case BIND_SHADER_RESOURCE:
                StageMask |= VulkanUtilities::VK_PIPELINE_STAGE_ALL_SHADERS;
                AccessMask |= VK_ACCESS_SHADER_READ_BIT;
                break;
            case BIND_RENDER_TARGET:
                StageMask |= VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT;
                AccessMask |= VK_ACCESS_COLOR_ATTACHMENT_READ_BIT | VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT;
                break;
            case BIND_DEPTH_STENCIL:
                StageMask |= VK_PIPELINE_STAGE_EARLY_FRAGMENT_TESTS_BIT | VK_PIPELINE_STAGE_LATE_FRAGMENT_TESTS_BIT;
                AccessMask |= VK_ACCESS_DEPTH_STENCIL_ATTACHMENT_READ_BIT | VK_ACCESS_DEPTH_STENCIL_ATTACHMENT_WRITE_BIT;
                break;
            case BIND_UNORDERED_ACCESS:
                StageMask |= VulkanUtilities::VK_PIPELINE_STAGE_ALL_SHADERS;
                AccessMask |= VK_ACCESS_SHADER_READ_BIT | VK_ACCESS_SHADER_WRITE_BIT;
                break;
            case BIND_INDIRECT_DRAW_ARGS:
                StageMask |= VK_PIPELINE_STAGE_DRAW_INDIRECT_BIT;
                AccessMask |= VK_ACCESS_INDIRECT_COMMAND_READ_BIT;
                break;
            case BIND_INPUT_ATTACHMENT:
                StageMask |= VK_PIPELINE_STAGE_FRAGMENT_SHADER_BIT;
                AccessMask |= VK_ACCESS_INPUT_ATTACHMENT_READ_BIT;
                break;
            case BIND_RAY_TRACING:
                StageMask |= VK_PIPELINE_STAGE_ACCELERATION_STRUCTURE_BUILD_BIT_KHR | VK_PIPELINE_STAGE_RAY_TRACING_SHADER_BIT_KHR;
                AccessMask |= VK_ACCESS_ACCELERATION_STRUCTURE_READ_BIT_KHR | VK_ACCESS_ACCELERATION_STRUCTURE_WRITE_BIT_KHR;
                break;
            case BIND_SHADING_RATE:
                StageMask |= VK_PIPELINE_STAGE_FRAGMENT_DENSITY_PROCESS_BIT_EXT | VK_PIPELINE_STAGE_FRAGMENT_SHADING_RATE_ATTACHMENT_BIT_KHR;
                AccessMask |= VK_ACCESS_FRAGMENT_DENSITY_MAP_READ_BIT_EXT | VK_ACCESS_FRAGMENT_SHADING_RATE_ATTACHMENT_READ_BIT_KHR;
                break;

            case BIND_NONE:
            case BIND_STREAM_OUTPUT:
            default:
                UNEXPECTED("Unexpected bind flag");
                break;
        }
    }
}